

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

dict_type * __thiscall phosg::JSON::as_dict_abi_cxx11_(JSON *this)

{
  bool bVar1;
  type_error *this_00;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
  *puVar2;
  allocator<char> local_31;
  string local_30;
  JSON *local_10;
  JSON *this_local;
  
  local_10 = this;
  bVar1 = is_dict(this);
  if (!bVar1) {
    this_00 = (type_error *)__cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"JSON value cannot be accessed as a dict",&local_31);
    type_error::type_error(this_00,&local_30);
    __cxa_throw(this_00,&type_error::typeinfo,type_error::~type_error);
  }
  puVar2 = ::std::
           get<std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                     (&this->value);
  return puVar2;
}

Assistant:

const JSON::dict_type& JSON::as_dict() const {
  if (!this->is_dict()) {
    throw type_error("JSON value cannot be accessed as a dict");
  }
  return ::get<dict_type>(this->value);
}